

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O0

void cpuid_grow_raw_data_array(cpu_raw_data_array_t *raw_array,logical_cpu_t n)

{
  cpu_raw_data_t *pcVar1;
  cpu_raw_data_t *tmp;
  logical_cpu_t i;
  logical_cpu_t n_local;
  cpu_raw_data_array_t *raw_array_local;
  
  if ((n != 0) && (raw_array->num_raw <= n)) {
    debugf(3,"Growing cpu_raw_data_array_t from %u to %u items\n",(ulong)raw_array->num_raw,(ulong)n
          );
    pcVar1 = (cpu_raw_data_t *)realloc(raw_array->raw,(ulong)n * 0x6b0);
    if (pcVar1 == (cpu_raw_data_t *)0x0) {
      cpuid_set_error(ERR_NO_MEM);
    }
    else {
      for (tmp._4_2_ = raw_array->num_raw; tmp._4_2_ < n; tmp._4_2_ = tmp._4_2_ + 1) {
        raw_data_t_constructor(pcVar1 + tmp._4_2_);
      }
      raw_array->num_raw = n;
      raw_array->raw = pcVar1;
    }
  }
  return;
}

Assistant:

static void cpuid_grow_raw_data_array(struct cpu_raw_data_array_t* raw_array, logical_cpu_t n)
{
	logical_cpu_t i;
	struct cpu_raw_data_t *tmp = NULL;

	if ((n <= 0) || (n < raw_array->num_raw)) return;
	debugf(3, "Growing cpu_raw_data_array_t from %u to %u items\n", raw_array->num_raw, n);
	tmp = realloc(raw_array->raw, sizeof(struct cpu_raw_data_t) * n);
	if (tmp == NULL) { /* Memory allocation failure */
		cpuid_set_error(ERR_NO_MEM);
		return;
	}

	for (i = raw_array->num_raw; i < n; i++)
		raw_data_t_constructor(&tmp[i]);
	raw_array->num_raw = n;
	raw_array->raw     = tmp;
}